

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void CLI::AsNumberWithUnit::validate_mapping<float>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                *mapping,Options opts)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  mapped_type_conflict2 *pmVar5;
  ValidationError *pVVar6;
  allocator local_15d;
  mapped_type_conflict2 local_15c;
  _Base_ptr local_158;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  *local_150;
  _Base_ptr local_148;
  string local_140;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  lower_mapping;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string s;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var3 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(mapping->_M_t)._M_impl.super__Rb_tree_header;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      if ((opts & CASE_INSENSITIVE) != CASE_SENSITIVE) {
        lower_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &lower_mapping._M_t._M_impl.super__Rb_tree_header._M_header;
        lower_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        lower_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        lower_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var3 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_150 = &mapping->_M_t;
        local_148 = &p_Var1->_M_header;
        lower_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             lower_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (p_Var3 != local_148) {
          local_158 = p_Var3;
          ::std::__cxx11::string::string((string *)&local_50,(string *)(p_Var3 + 1));
          detail::to_lower(&s,&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          sVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                  ::count(&lower_mapping,&s);
          if (sVar4 != 0) {
            pVVar6 = (ValidationError *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string
                      ((string *)&local_140,
                       "Several matching lowercase unit representations are found: ",&local_15d);
            ::std::operator+(&local_f0,&local_140,&s);
            ValidationError::ValidationError(pVVar6,&local_f0);
            __cxa_throw(pVVar6,&ValidationError::typeinfo,Error::~Error);
          }
          local_15c = (mapped_type_conflict2)local_158[2]._M_color;
          ::std::__cxx11::string::string((string *)&local_70,(string *)(p_Var3 + 1));
          detail::to_lower(&local_140,&local_70);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                   ::operator[](&lower_mapping,&local_140);
          *pmVar5 = local_15c;
          ::std::__cxx11::string::~string((string *)&local_140);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&s);
          p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_158);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
        ::operator=(local_150,&lower_mapping._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
        ::~_Rb_tree(&lower_mapping._M_t);
      }
      return;
    }
    if (p_Var3[1]._M_parent == (_Base_ptr)0x0) break;
    iVar2 = detail::isalpha((int)p_Var3 + 0x20);
    if ((char)iVar2 == '\0') {
      pVVar6 = (ValidationError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_b0,"Unit must contain only letters.",(allocator *)&lower_mapping);
      ValidationError::ValidationError(pVVar6,&local_b0);
      __cxa_throw(pVVar6,&ValidationError::typeinfo,Error::~Error);
    }
    p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
  }
  pVVar6 = (ValidationError *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string
            ((string *)&local_90,"Unit must not be empty.",(allocator *)&lower_mapping);
  ValidationError::ValidationError(pVVar6,&local_90);
  __cxa_throw(pVVar6,&ValidationError::typeinfo,Error::~Error);
}

Assistant:

static void validate_mapping(std::map<std::string, Number> &mapping, Options opts) {
        for(auto &kv : mapping) {
            if(kv.first.empty()) {
                throw ValidationError("Unit must not be empty.");
            }
            if(!detail::isalpha(kv.first)) {
                throw ValidationError("Unit must contain only letters.");
            }
        }

        // make all units lowercase if CASE_INSENSITIVE
        if(opts & CASE_INSENSITIVE) {
            std::map<std::string, Number> lower_mapping;
            for(auto &kv : mapping) {
                auto s = detail::to_lower(kv.first);
                if(lower_mapping.count(s)) {
                    throw ValidationError(std::string("Several matching lowercase unit representations are found: ") +
                                          s);
                }
                lower_mapping[detail::to_lower(kv.first)] = kv.second;
            }
            mapping = std::move(lower_mapping);
        }
    }